

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

QSize __thiscall QMdiSubWindow::sizeHint(QMdiSubWindow *this)

{
  QMdiSubWindowPrivate *this_00;
  int iVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  undefined8 uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  long in_FS_OFFSET;
  int minWidth;
  int margin;
  int local_38;
  int local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMdiSubWindowPrivate **)&(this->super_QWidget).field_0x8;
  local_34 = -0x55555556;
  local_38 = -0x55555556;
  QMdiSubWindowPrivate::sizeParameters(this_00,&local_34,&local_38);
  iVar1 = local_34;
  uVar7 = local_34 * 2;
  iVar3 = QMdiSubWindowPrivate::titleBarHeight(this_00);
  uVar9 = iVar3 + iVar1;
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)&this_00->baseWidget);
  if (bVar2) {
    uVar4 = (**(code **)(*(long *)(this_00->baseWidget).wp.value + 0x70))();
    if ((uVar4 & 0x8000000080000000) == 0) {
      uVar5 = (**(code **)(*(long *)(this_00->baseWidget).wp.value + 0x70))();
      uVar7 = uVar7 + (int)uVar5;
      uVar9 = uVar9 + (int)((ulong)uVar5 >> 0x20);
    }
  }
  uVar4 = (**(code **)(*(long *)&this->super_QWidget + 0x78))(this);
  uVar6 = uVar4 >> 0x20;
  uVar8 = (ulong)uVar7;
  if ((int)uVar7 <= (int)uVar4) {
    uVar8 = uVar4 & 0xffffffff;
  }
  if ((int)(uVar4 >> 0x20) < (int)uVar9) {
    uVar6 = (ulong)uVar9;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QSize)(uVar8 | uVar6 << 0x20);
  }
  __stack_chk_fail();
}

Assistant:

QSize QMdiSubWindow::sizeHint() const
{
    Q_D(const QMdiSubWindow);
    int margin, minWidth;
    d->sizeParameters(&margin, &minWidth);
    QSize size(2 * margin, d->titleBarHeight() + margin);
    if (d->baseWidget && d->baseWidget->sizeHint().isValid())
        size += d->baseWidget->sizeHint();
    return size.expandedTo(minimumSizeHint());
}